

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::EncConfig::endEncrypt(EncConfig *this)

{
  Config *pCVar1;
  element_type *peVar2;
  allocator<char> local_31;
  string local_30;
  
  pCVar1 = this->config;
  peVar2 = (pCVar1->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->keylen == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"encryption key length is required",&local_31);
    usage(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pCVar1 = this->config;
    peVar2 = (pCVar1->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar2->encrypt = true;
  peVar2->decrypt = false;
  peVar2->copy_encryption = false;
  return pCVar1;
}

Assistant:

QPDFJob::Config*
QPDFJob::EncConfig::endEncrypt()
{
    if (config->o.m->keylen == 0) {
        usage("encryption key length is required");
    }
    config->o.m->encrypt = true;
    config->o.m->decrypt = false;
    config->o.m->copy_encryption = false;
    return this->config;
}